

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kparser.cc
# Opt level: O2

void InitCommandLine(int argc,char **argv,variables_map *conf)

{
  uint uVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  char *pcVar3;
  typed_value<float,_char> *ptVar4;
  typed_value<unsigned_int,_char> *ptVar5;
  size_type sVar6;
  ostream *poVar7;
  uint uVar8;
  uint local_19c;
  basic_parsed_options<char> local_198;
  uint local_170 [6];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_158;
  options_description dcmdline_options;
  options_description opts;
  
  std::__cxx11::string::string
            ((string *)&dcmdline_options,"Configuration options",(allocator *)&local_198);
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar8 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&opts,(string *)&dcmdline_options,
             (uint)boost::program_options::options_description::m_default_line_length,uVar8);
  std::__cxx11::string::~string((string *)&dcmdline_options);
  _dcmdline_options = boost::program_options::options_description::add_options();
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&dcmdline_options,(value_semantic *)"training_data,T",
                              (char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"dev_data,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"bracketing_dev_data,C",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"test_data,p",(char *)ptVar2);
  ptVar4 = boost::program_options::value<float>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"dropout,D",(char *)ptVar4);
  ptVar5 = boost::program_options::value<unsigned_int>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"samples,s",(char *)ptVar5);
  ptVar4 = boost::program_options::value<float>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"alpha,a",(char *)ptVar4);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"model,m",(char *)ptVar2);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"use_pos_tags,P");
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_198.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,(uint *)&local_198);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)0x33c17f,(char *)ptVar5);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_19c = 0x10;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar5,&local_19c)
  ;
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"action_dim",(char *)ptVar5);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_170[5] = 0xc;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,local_170 + 5);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"pos_dim",(char *)ptVar5);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_170[4] = 0x20;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,local_170 + 4);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)0x2d1320,(char *)ptVar5);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_170[3] = 0x40;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,local_170 + 3);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"hidden_dim",(char *)ptVar5);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_170[2] = 0x32;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,local_170 + 2);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"pretrained_dim",(char *)ptVar5);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_170[1] = 0x3c;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,local_170 + 1);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"lstm_input_dim",(char *)ptVar5);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"train,t");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"words,w",(char *)ptVar2);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_170[0] = 1;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar5,local_170);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"beam_size,b",(char *)ptVar5);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar3,"debug")
  ;
  boost::program_options::options_description_easy_init::operator()(pcVar3,"help,h");
  boost::program_options::options_description::options_description(&dcmdline_options,uVar1,uVar8);
  boost::program_options::options_description::add(&dcmdline_options);
  local_158.super_function_base.vtable = (vtable_base *)0x0;
  local_158.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_158.super_function_base.functor._8_8_ = 0;
  local_158.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            (&local_198,argc,argv,&dcmdline_options,0,&local_158);
  boost::program_options::store((basic_parsed_options *)&local_198,conf,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_198.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_158);
  std::__cxx11::string::string((string *)&local_198,"help",(allocator *)&local_19c);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(conf + 0x10),(key_type *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if (sVar6 == 0) {
    std::__cxx11::string::string((string *)&local_198,"training_data",(allocator *)&local_19c);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)(conf + 0x10),(key_type *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    if (sVar6 != 0) {
      boost::program_options::options_description::~options_description(&dcmdline_options);
      boost::program_options::options_description::~options_description(&opts);
      return;
    }
    std::operator<<((ostream *)&std::cerr,
                    "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n"
                   );
  }
  else {
    poVar7 = (ostream *)boost::program_options::operator<<((ostream *)&std::cerr,&dcmdline_options);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  exit(1);
}

Assistant:

void InitCommandLine(int argc, char** argv, po::variables_map* conf) {
  po::options_description opts("Configuration options");
  opts.add_options()
        ("training_data,T", po::value<string>(), "List of Transitions - Training corpus")
        ("dev_data,d", po::value<string>(), "Development corpus")
        ("bracketing_dev_data,C", po::value<string>(), "Development bracketed corpus")

        ("test_data,p", po::value<string>(), "Test corpus")
        ("dropout,D", po::value<float>(), "Dropout rate")
        ("samples,s", po::value<unsigned>(), "Sample N trees for each test sentence instead of greedy max decoding")
        ("alpha,a", po::value<float>(), "Flatten (0 < alpha < 1) or sharpen (1 < alpha) sampling distribution")
        ("model,m", po::value<string>(), "Load saved model from this file")
        ("use_pos_tags,P", "make POS tags visible to parser")
        ("layers", po::value<unsigned>()->default_value(2), "number of LSTM layers")
        ("action_dim", po::value<unsigned>()->default_value(16), "action embedding size")
        ("pos_dim", po::value<unsigned>()->default_value(12), "POS dimension")
        ("input_dim", po::value<unsigned>()->default_value(32), "input embedding size")
        ("hidden_dim", po::value<unsigned>()->default_value(64), "hidden dimension")
        ("pretrained_dim", po::value<unsigned>()->default_value(50), "pretrained input dimension")
        ("lstm_input_dim", po::value<unsigned>()->default_value(60), "LSTM input dimension")
        ("train,t", "Should training be run?")
        ("words,w", po::value<string>(), "Pretrained word embeddings")
        ("beam_size,b", po::value<unsigned>()->default_value(1), "beam size")
	("debug","debug")
        ("help,h", "Help");
  po::options_description dcmdline_options;
  dcmdline_options.add(opts);
  po::store(parse_command_line(argc, argv, dcmdline_options), *conf);
  if (conf->count("help")) {
    cerr << dcmdline_options << endl;
    exit(1);
  }
  if (conf->count("training_data") == 0) {
    cerr << "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n";
    exit(1);
  }
}